

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void generate_seeds(picnic_instance_t *pp,picnic_context_t *context,uint8_t *seeds,uint8_t *salt)

{
  kdf_shake_t ctx;
  uint input_output_size;
  uint num_rounds;
  uint seed_size;
  undefined6 in_stack_fffffffffffffee8;
  uint16_t in_stack_fffffffffffffeee;
  hash_context *in_stack_fffffffffffffef0;
  
  hash_init(in_stack_fffffffffffffef0,CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
  ;
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x138667);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x138689);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x1386a8);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x1386c7);
  hash_update_uint16_le(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  hash_final((hash_context *)0x1386e6);
  hash_squeeze(in_stack_fffffffffffffef0,
               (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x13870e);
  hash_squeeze(in_stack_fffffffffffffef0,
               (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x138725);
  return;
}

Assistant:

static void generate_seeds(const picnic_instance_t* pp, const picnic_context_t* context,
                           uint8_t* seeds, uint8_t* salt) {
  const unsigned int seed_size         = pp->seed_size;
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;

  kdf_shake_t ctx;
  kdf_shake_init(&ctx, pp->digest_size);
  // sk || m || C || p
  kdf_shake_update_key(&ctx, context->private_key, input_output_size);
  kdf_shake_update_key(&ctx, context->msg, context->msglen);
  kdf_shake_update_key(&ctx, context->public_key, input_output_size);
  kdf_shake_update_key(&ctx, context->plaintext, input_output_size);
  // N as 16 bit LE integer
  kdf_shake_update_key_uint16_le(&ctx, pp->lowmc.n);
#if defined(WITH_EXTRA_RANDOMNESS)
  // Add extra random bytes for fault attack mitigation
  unsigned char buffer[2 * MAX_DIGEST_SIZE];
  rand_bits(buffer, 2 * seed_size * 8);
  kdf_shake_update_key(&ctx, buffer, 2 * seed_size);
#endif
  kdf_shake_finalize_key(&ctx);

  // Generate seeds and salt
  kdf_shake_get_randomness(&ctx, seeds, seed_size * num_rounds * SC_PROOF);
  kdf_shake_get_randomness(&ctx, salt, SALT_SIZE);
  kdf_shake_clear(&ctx);
}